

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O1

void gen_local_scope_parser(void *context,fb_scope_t *scope)

{
  int iVar1;
  int iVar2;
  dict_entry_t *__base;
  trie_t trie;
  fb_symbol_text_t scope_name;
  trie_t local_148;
  undefined8 local_118;
  undefined8 uStack_110;
  dict_entry_t *local_108;
  char local_f8 [208];
  
  local_148.dict = (dict_entry_t *)0x0;
  local_148.gen_match = (gen_match_f *)0x0;
  local_148.gen_unmatched = (gen_unmatched_f *)0x0;
  local_148.ct = (fb_compound_type_t *)0x0;
  local_148.type = 0;
  local_148.union_total = 0;
  local_148.label = 0;
  local_148._44_4_ = 0;
  __flatcc_fb_copy_scope(scope,local_f8);
  uStack_110 = *(undefined8 *)((long)context + 0xd8);
  local_118 = 0;
  local_108 = (dict_entry_t *)0x0;
  fb_symbol_table_visit(&scope->symbol_index,count_visible_enum_symbol,&local_118);
  iVar2 = (int)local_118;
  if ((long)(int)local_118 == 0) {
LAB_00113bf0:
    __base = (dict_entry_t *)0x0;
  }
  else {
    __base = (dict_entry_t *)malloc((long)(int)local_118 << 5);
    if (__base == (dict_entry_t *)0x0) goto LAB_00113bf0;
    local_108 = __base;
    fb_symbol_table_visit(&scope->symbol_index,install_visible_enum_symbol,&local_118);
    qsort(__base,(long)(int)local_118,0x20,dict_cmp);
  }
  local_148.dict = __base;
  if (iVar2 < 1 || __base != (dict_entry_t *)0x0) {
    local_148.ct = (fb_compound_type_t *)0x0;
    local_148.type = 3;
    local_148.gen_match = gen_scope_match;
    local_148.gen_unmatched = gen_scope_unmatched;
    println((fb_output_t *)context,
            "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
            ,*(undefined8 *)(*(long *)((long)context + 0xd8) + 0x110),local_f8);
    *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 2;
    println((fb_output_t *)context,"int *value_type, uint64_t *value, int *aggregate)");
    iVar1 = *(int *)((long)context + 0xf0);
    if (iVar1 != 0) {
      *(int *)((long)context + 0xf0) = iVar1 + -1;
      if (iVar1 + -1 != 0) {
        *(int *)((long)context + 0xf0) = iVar1 + -2;
        println((fb_output_t *)context,"{");
        *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 1;
        if (iVar2 == 0) {
          println((fb_output_t *)context,"/* Scope has no enum / union types to look up. */");
          println((fb_output_t *)context,"return buf; /* unmatched; */");
          iVar2 = *(int *)((long)context + 0xf0);
          if (iVar2 == 0) goto LAB_00113df5;
        }
        else {
          println((fb_output_t *)context,"const char *unmatched = buf;");
          println((fb_output_t *)context,"const char *mark;");
          println((fb_output_t *)context,"uint64_t w;");
          println((fb_output_t *)context,"");
          println((fb_output_t *)context,"w = flatcc_json_parser_symbol_part(buf, end);");
          gen_trie((fb_output_t *)context,&local_148,0,iVar2 + -1,0);
          println((fb_output_t *)context,"return buf;");
          iVar2 = *(int *)((long)context + 0xf0);
          if (iVar2 == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x4c3,"void gen_local_scope_parser(void *, fb_scope_t *)");
          }
        }
        *(int *)((long)context + 0xf0) = iVar2 + -1;
        println((fb_output_t *)context,"}");
        println((fb_output_t *)context,"");
        if (local_148.dict != (dict_entry_t *)0x0) {
          free(local_148.dict);
        }
        return;
      }
    }
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x4b5,"void gen_local_scope_parser(void *, fb_scope_t *)");
  }
  gen_local_scope_parser_cold_1();
LAB_00113df5:
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x4ba,"void gen_local_scope_parser(void *, fb_scope_t *)");
}

Assistant:

static void gen_local_scope_parser(void *context, fb_scope_t *scope)
{
    fb_output_t *out = context;
    int n = 0;
    trie_t trie;
    fb_symbol_text_t scope_name;

    fb_clear(trie);
    fb_copy_scope(scope, scope_name);
    if (((trie.dict = build_local_scope_dict(out->S, scope, &n)) == 0) && n > 0) {
        gen_panic(out, "internal error: could not build dictionary for json parser\n");
        return;
    }
    /* Not used for scopes. */
    trie.ct = 0;
    trie.type = local_scope_trie;
    trie.gen_match = gen_scope_match;
    trie.gen_unmatched = gen_scope_unmatched;
    println(out, "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,",
        out->S->basename, scope_name);
    indent(); indent();
    println(out, "int *value_type, uint64_t *value, int *aggregate)");
    unindent(); unindent();
    println(out, "{"); indent();
    if (n == 0) {
        println(out, "/* Scope has no enum / union types to look up. */");
        println(out, "return buf; /* unmatched; */");
        unindent(); println(out, "}");
    } else {
        println(out, "const char *unmatched = buf;");
        println(out, "const char *mark;");
        println(out, "uint64_t w;");
        println(out, "");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, &trie, 0, n - 1, 0);
        println(out, "return buf;");
        unindent(); println(out, "}");
    }
    println(out, "");
    clear_dict(trie.dict);
}